

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O3

string * __thiscall
cmExtraCodeLiteGenerator::GetBuildCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf)

{
  pointer pcVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  string make;
  string generator;
  ostringstream ss;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  long *local_1b8 [2];
  long local_1a8 [2];
  undefined1 local_198 [112];
  ios_base local_128 [264];
  
  pcVar1 = local_198 + 0x10;
  local_198._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"CMAKE_GENERATOR","");
  pcVar3 = cmMakefile::GetSafeDefinition(mf,(string *)local_198);
  std::__cxx11::string::string((string *)local_1d8,pcVar3,(allocator *)&local_1f8);
  if ((pointer)local_198._0_8_ != pcVar1) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  local_198._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"CMAKE_MAKE_PROGRAM","");
  pcVar3 = cmMakefile::GetRequiredDefinition(mf,(string *)local_198);
  std::__cxx11::string::string((string *)&local_1f8,pcVar3,(allocator *)local_1b8);
  if ((pointer)local_198._0_8_ != pcVar1) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_1f8,(long)local_1f8 + local_1f0);
  iVar2 = std::__cxx11::string::compare((char *)local_1d8);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)local_1d8);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)local_1d8);
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare((char *)local_1d8);
        if (iVar2 != 0) goto LAB_0030a5f3;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,(char *)local_1f8,local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," -j ",4);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1b8);
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0],local_1a8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base(local_128);
      goto LAB_0030a5f3;
    }
  }
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
LAB_0030a5f3:
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmExtraCodeLiteGenerator::GetBuildCommand(const cmMakefile* mf) const
{
  std::string generator = mf->GetSafeDefinition("CMAKE_GENERATOR");
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string buildCommand = make; // Default
  if ( generator == "NMake Makefiles" ||
       generator == "Ninja" )
    {
    buildCommand = make;
    }
  else if ( generator == "MinGW Makefiles" ||
            generator == "Unix Makefiles" )
    {
    std::ostringstream ss;
    ss << make << " -j " << this->CpuCount;
    buildCommand = ss.str();
    }
  return buildCommand;
}